

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O3

int __thiscall ncnn::Interp::forward(Interp *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  size_t sVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  uint _c;
  uint w;
  uint uVar5;
  int *piVar6;
  void *pvVar7;
  size_t sVar8;
  size_t sVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  void *pvVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  float *pfVar22;
  Mat *pMVar23;
  int iVar24;
  float *pfVar25;
  long lVar26;
  void *pvVar27;
  float *pfVar28;
  int iVar29;
  float *pfVar30;
  float *pfVar31;
  size_t sVar32;
  float fVar33;
  int iVar34;
  float fVar35;
  ulong uVar36;
  float *pfVar37;
  ulong uVar38;
  float *pfVar39;
  float *pfVar40;
  long lVar41;
  long lVar42;
  int iVar43;
  float fVar44;
  float fVar46;
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float *local_100;
  size_t local_f8;
  undefined8 local_f0;
  float *local_e8;
  float *local_e0;
  float *local_d8;
  float *local_d0;
  float *local_c8;
  float *local_c0;
  ulong local_b8;
  float *local_b0;
  float *local_a8;
  float *local_a0;
  float *local_98;
  Mat *local_90;
  float *local_88;
  float *local_80;
  ulong local_78;
  float *local_70;
  float *local_68;
  float *local_60;
  float *local_58;
  Mat *local_50;
  float *local_48;
  ulong local_40;
  float *local_38;
  
  _c = bottom_blob->w;
  uVar21 = this->output_width;
  uVar19 = this->output_height;
  if (bottom_blob->dims == 1) {
    uVar5 = 1;
    w = 1;
  }
  else {
    w = bottom_blob->h;
    uVar5 = _c;
    _c = bottom_blob->c;
  }
  local_f8 = (size_t)uVar5;
  if (uVar21 == 0 || uVar19 == 0) {
    uVar19 = (uint)((float)(int)w * this->height_scale);
    uVar21 = (uint)((float)(int)uVar5 * this->width_scale);
  }
  uVar36 = (ulong)uVar21;
  local_e0 = (float *)(ulong)uVar19;
  if ((uVar19 == w) && (uVar21 == uVar5)) {
    if (top_blob != bottom_blob) {
      piVar6 = bottom_blob->refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      piVar6 = top_blob->refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (**(code **)(*(long *)top_blob->allocator + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->c = 0;
      top_blob->cstep = 0;
      piVar6 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar6;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar43 = bottom_blob->w;
      iVar34 = bottom_blob->h;
      iVar29 = bottom_blob->c;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar43;
      top_blob->h = iVar34;
      top_blob->c = iVar29;
      top_blob->cstep = bottom_blob->cstep;
      return 0;
    }
    return 0;
  }
  local_e8 = (float *)CONCAT44(local_e8._4_4_,_c);
  Mat::create(top_blob,uVar21,uVar19,_c,bottom_blob->elemsize,opt->blob_allocator);
  auVar13 = _DAT_00176790;
  auVar12 = _DAT_00176780;
  auVar11 = _DAT_00175f00;
  pvVar27 = top_blob->data;
  if (pvVar27 == (void *)0x0) {
    return -100;
  }
  local_f0 = top_blob->cstep;
  if ((long)top_blob->c * local_f0 == 0) {
    return -100;
  }
  if (bottom_blob->dims == 1) {
    if (0 < (int)local_e8) {
      uVar21 = top_blob->h * top_blob->w;
      pvVar7 = bottom_blob->data;
      lVar26 = (ulong)uVar21 - 1;
      auVar45._8_4_ = (int)lVar26;
      auVar45._0_8_ = lVar26;
      auVar45._12_4_ = (int)((ulong)lVar26 >> 0x20);
      lVar26 = (long)pvVar27 + 0xc;
      sVar32 = top_blob->elemsize;
      uVar36 = 0;
      auVar45 = auVar45 ^ _DAT_00175f00;
      do {
        if (0 < (int)uVar21) {
          uVar3 = *(undefined4 *)((long)pvVar7 + uVar36 * 4);
          uVar38 = 0;
          do {
            auVar47._8_4_ = (int)uVar38;
            auVar47._0_8_ = uVar38;
            auVar47._12_4_ = (int)(uVar38 >> 0x20);
            auVar48 = (auVar47 | auVar13) ^ auVar11;
            iVar43 = auVar45._4_4_;
            if ((bool)(~(iVar43 < auVar48._4_4_ ||
                        auVar45._0_4_ < auVar48._0_4_ && auVar48._4_4_ == iVar43) & 1)) {
              *(undefined4 *)(lVar26 + -0xc + uVar38 * 4) = uVar3;
            }
            if (auVar48._12_4_ <= auVar45._12_4_ &&
                (auVar48._8_4_ <= auVar45._8_4_ || auVar48._12_4_ != auVar45._12_4_)) {
              *(undefined4 *)(lVar26 + -8 + uVar38 * 4) = uVar3;
            }
            auVar47 = (auVar47 | auVar12) ^ auVar11;
            iVar34 = auVar47._4_4_;
            if (iVar34 <= iVar43 && (iVar34 != iVar43 || auVar47._0_4_ <= auVar45._0_4_)) {
              *(undefined4 *)(lVar26 + -4 + uVar38 * 4) = uVar3;
              *(undefined4 *)(lVar26 + uVar38 * 4) = uVar3;
            }
            uVar38 = uVar38 + 4;
          } while ((uVar21 + 3 & 0xfffffffc) != uVar38);
        }
        uVar36 = uVar36 + 1;
        lVar26 = lVar26 + local_f0 * sVar32;
      } while (uVar36 != ((ulong)local_e8 & 0xffffffff));
    }
  }
  else {
    uVar19 = this->resize_type;
    iVar43 = (int)local_e0;
    local_90 = bottom_blob;
    local_50 = top_blob;
    if (uVar19 == 3) {
      iVar34 = uVar21 * 5 + (int)local_e0 * 5;
      uVar36 = 0xffffffffffffffff;
      if (-1 < iVar34) {
        uVar36 = (long)iVar34 * 4;
      }
      local_c0 = (float *)operator_new__(uVar36);
      local_f0 = (size_t)(int)uVar21;
      pfVar15 = local_c0 + local_f0;
      pfVar17 = pfVar15 + iVar43;
      cubic_coeffs((int)local_f8,uVar21,(int *)local_c0,pfVar17);
      local_d8 = pfVar15;
      local_48 = pfVar17 + (int)(uVar21 * 4);
      cubic_coeffs(w,iVar43,(int *)pfVar15,pfVar17 + (int)(uVar21 * 4));
      pfVar15 = local_c0;
      if (0 < (int)local_e8) {
        local_40 = (ulong)local_e8 & 0xffffffff;
        pfVar17 = local_c0 + local_f0 + (long)iVar43;
        uVar36 = 0;
        pMVar23 = local_90;
        local_e8 = pfVar17;
        do {
          local_a8 = (float *)CONCAT44(local_a8._4_4_,pMVar23->w);
          local_c8 = (float *)pMVar23->elemsize;
          local_d0 = (float *)(pMVar23->cstep * uVar36 * (long)local_c8 + (long)pMVar23->data);
          uVar21 = local_50->w;
          uVar38 = (ulong)(int)uVar21;
          local_b0 = (float *)(ulong)(uint)local_50->h;
          pvVar27 = local_50->data;
          local_f0 = local_50->elemsize;
          sVar32 = local_50->cstep;
          local_78 = uVar36;
          if (uVar38 == 0) {
            local_98 = (float *)0x0;
            local_58 = (float *)0x0;
            local_60 = (float *)0x0;
            local_a0 = (float *)0x0;
            local_68 = (float *)0x0;
            local_80 = (float *)0x0;
            local_70 = (float *)0x0;
            local_88 = (float *)0x0;
          }
          else {
            sVar2 = uVar38 * 4 + 4;
            local_100 = (float *)0x0;
            iVar43 = posix_memalign(&local_100,0x10,sVar2);
            local_98 = local_100;
            local_58 = (float *)0x0;
            if (iVar43 == 0) {
              local_58 = local_100;
            }
            local_58 = local_58 + uVar38;
            *local_58 = 1.4013e-45;
            local_100 = (float *)0x0;
            iVar43 = posix_memalign(&local_100,0x10,sVar2);
            local_a0 = local_100;
            local_60 = (float *)0x0;
            if (iVar43 == 0) {
              local_60 = local_100;
            }
            local_60 = local_60 + uVar38;
            *local_60 = 1.4013e-45;
            local_100 = (float *)0x0;
            iVar43 = posix_memalign(&local_100,0x10,sVar2);
            local_80 = local_100;
            local_68 = (float *)0x0;
            if (iVar43 == 0) {
              local_68 = local_100;
            }
            local_68 = local_68 + uVar38;
            *local_68 = 1.4013e-45;
            local_100 = (float *)0x0;
            iVar43 = posix_memalign(&local_100,0x10,sVar2);
            local_88 = local_100;
            local_70 = (float *)0x0;
            if (iVar43 == 0) {
              local_70 = local_100;
            }
            local_70 = local_70 + uVar38;
            *local_70 = 1.4013e-45;
          }
          if (0 < (int)local_b0) {
            local_d0 = local_d0 + -1;
            lVar26 = (ulong)uVar21 * 4;
            pvVar27 = (void *)((long)pvVar27 + sVar32 * local_f0 * local_78);
            local_f0 = local_f0 * uVar38;
            pfVar28 = (float *)0x0;
            pfVar15 = local_a0;
            pfVar25 = local_80;
            pfVar30 = local_88;
            pfVar16 = local_48;
            pfVar39 = local_98;
            uVar36 = 0xfffffffd;
            do {
              fVar33 = local_d8[(long)pfVar28];
              uVar20 = (ulong)(uint)fVar33;
              fVar35 = (float)uVar36;
              pfVar22 = pfVar15;
              pfVar31 = pfVar30;
              pfVar37 = pfVar39;
              pfVar40 = pfVar25;
              if (fVar33 == fVar35) {
LAB_00169bd7:
                local_f8 = uVar20;
                if (0 < (int)uVar21) {
                  fVar33 = *pfVar16;
                  fVar35 = pfVar16[1];
                  fVar44 = pfVar16[2];
                  fVar46 = pfVar16[3];
                  lVar41 = 0;
                  do {
                    *(float *)((long)pvVar27 + lVar41 * 4) =
                         pfVar31[lVar41] * fVar46 + pfVar22[lVar41] * fVar35 +
                         pfVar40[lVar41] * fVar44 + pfVar37[lVar41] * fVar33;
                    lVar41 = lVar41 + 1;
                  } while (uVar21 != (uint)lVar41);
                }
              }
              else if (fVar33 == (float)((int)fVar35 + 1)) {
                pfVar22 = pfVar25;
                pfVar31 = pfVar39;
                pfVar37 = pfVar15;
                pfVar40 = pfVar30;
                if (0 < (int)uVar21) {
                  lVar41 = 0;
                  do {
                    pfVar15 = pfVar17 + lVar41;
                    pfVar25 = (float *)((long)local_d0 +
                                       (long)*(int *)((long)local_c0 + lVar41) * 4 +
                                       (long)(((int)fVar33 + 2) * (int)local_a8) * (long)local_c8);
                    *(float *)((long)pfVar39 + lVar41) =
                         pfVar25[3] * pfVar15[3] + pfVar25[1] * pfVar15[1] +
                         pfVar25[2] * pfVar15[2] + *pfVar25 * *pfVar15;
                    lVar41 = lVar41 + 4;
                  } while (lVar26 - lVar41 != 0);
                  goto LAB_00169bd7;
                }
              }
              else if (fVar33 == (float)((int)fVar35 + 2)) {
                pfVar22 = pfVar30;
                pfVar31 = pfVar15;
                pfVar37 = pfVar25;
                pfVar40 = pfVar39;
                if (0 < (int)uVar21) {
                  lVar41 = 0;
                  do {
                    iVar43 = *(int *)((long)local_c0 + lVar41);
                    pfVar25 = pfVar17 + lVar41;
                    fVar35 = *pfVar25;
                    fVar44 = pfVar25[1];
                    fVar46 = pfVar25[2];
                    fVar10 = pfVar25[3];
                    pfVar25 = (float *)((long)local_d0 +
                                       (long)iVar43 * 4 +
                                       (long)(((int)fVar33 + 1) * (int)local_a8) * (long)local_c8);
                    *(float *)((long)pfVar39 + lVar41) =
                         pfVar25[3] * fVar10 + pfVar25[1] * fVar44 +
                         pfVar25[2] * fVar46 + *pfVar25 * fVar35;
                    pfVar25 = (float *)((long)local_d0 +
                                       (long)iVar43 * 4 +
                                       (long)(((int)fVar33 + 2) * (int)local_a8) * (long)local_c8);
                    *(float *)((long)pfVar15 + lVar41) =
                         pfVar25[3] * fVar10 + pfVar25[1] * fVar44 +
                         pfVar25[2] * fVar46 + *pfVar25 * fVar35;
                    lVar41 = lVar41 + 4;
                    local_e0 = pfVar30;
                  } while (lVar26 - lVar41 != 0);
                  goto LAB_00169bd7;
                }
              }
              else if (fVar33 == (float)((int)fVar35 + 3)) {
                pfVar22 = pfVar39;
                pfVar31 = pfVar25;
                pfVar37 = pfVar30;
                pfVar40 = pfVar15;
                if (0 < (int)uVar21) {
                  lVar41 = 0;
                  do {
                    lVar42 = (long)*(int *)((long)local_c0 + lVar41);
                    pfVar1 = pfVar17 + lVar41;
                    fVar35 = *pfVar1;
                    fVar44 = pfVar1[1];
                    fVar46 = pfVar1[2];
                    fVar10 = pfVar1[3];
                    pfVar1 = (float *)((long)local_d0 +
                                      lVar42 * 4 +
                                      (long)((int)fVar33 * (int)local_a8) * (long)local_c8);
                    *(float *)((long)pfVar39 + lVar41) =
                         pfVar1[3] * fVar10 + pfVar1[1] * fVar44 +
                         pfVar1[2] * fVar46 + *pfVar1 * fVar35;
                    pfVar1 = (float *)((long)local_d0 +
                                      lVar42 * 4 +
                                      (long)(((int)fVar33 + 1) * (int)local_a8) * (long)local_c8);
                    *(float *)((long)pfVar15 + lVar41) =
                         pfVar1[3] * fVar10 + pfVar1[1] * fVar44 +
                         pfVar1[2] * fVar46 + *pfVar1 * fVar35;
                    pfVar1 = (float *)((long)local_d0 +
                                      lVar42 * 4 +
                                      (long)(((int)fVar33 + 2) * (int)local_a8) * (long)local_c8);
                    *(float *)((long)pfVar25 + lVar41) =
                         pfVar1[3] * fVar10 + pfVar1[1] * fVar44 +
                         pfVar1[2] * fVar46 + *pfVar1 * fVar35;
                    lVar41 = lVar41 + 4;
                    local_e0 = pfVar30;
                  } while (lVar26 - lVar41 != 0);
                  goto LAB_00169bd7;
                }
              }
              else if (0 < (int)uVar21) {
                local_e0 = (float *)((long)(((int)fVar33 + -1) * (int)local_a8) * (long)local_c8 +
                                    (long)local_d0);
                lVar41 = 0;
                do {
                  lVar42 = (long)*(int *)((long)local_c0 + lVar41);
                  pfVar17 = local_e8 + lVar41;
                  fVar35 = *pfVar17;
                  fVar44 = pfVar17[1];
                  fVar46 = pfVar17[2];
                  fVar10 = pfVar17[3];
                  pfVar17 = local_e0 + lVar42;
                  *(float *)((long)pfVar39 + lVar41) =
                       pfVar17[3] * fVar10 + pfVar17[1] * fVar44 +
                       pfVar17[2] * fVar46 + *pfVar17 * fVar35;
                  pfVar17 = (float *)((long)local_d0 +
                                     lVar42 * 4 +
                                     (long)((int)fVar33 * (int)local_a8) * (long)local_c8);
                  *(float *)((long)pfVar15 + lVar41) =
                       pfVar17[3] * fVar10 + pfVar17[1] * fVar44 +
                       pfVar17[2] * fVar46 + *pfVar17 * fVar35;
                  pfVar17 = (float *)((long)local_d0 +
                                     lVar42 * 4 +
                                     (long)(((int)fVar33 + 1) * (int)local_a8) * (long)local_c8);
                  *(float *)((long)pfVar25 + lVar41) =
                       pfVar17[3] * fVar10 + pfVar17[1] * fVar44 +
                       pfVar17[2] * fVar46 + *pfVar17 * fVar35;
                  pfVar17 = (float *)((long)local_d0 +
                                     lVar42 * 4 +
                                     (long)(((int)fVar33 + 2) * (int)local_a8) * (long)local_c8);
                  *(float *)((long)pfVar30 + lVar41) =
                       pfVar17[3] * fVar10 + pfVar17[1] * fVar44 +
                       pfVar17[2] * fVar46 + *pfVar17 * fVar35;
                  lVar41 = lVar41 + 4;
                  pfVar17 = local_e8;
                  local_38 = pfVar16;
                } while (lVar26 - lVar41 != 0);
                goto LAB_00169bd7;
              }
              pfVar25 = pfVar40;
              pfVar15 = pfVar22;
              pfVar16 = pfVar16 + 4;
              pfVar28 = (float *)((long)pfVar28 + 1);
              pvVar27 = (void *)((long)pvVar27 + local_f0);
              pfVar30 = pfVar31;
              pfVar39 = pfVar37;
              uVar36 = uVar20;
              local_b8 = uVar38;
            } while (pfVar28 != local_b0);
          }
          if (local_70 != (float *)0x0) {
            LOCK();
            *local_70 = (float)((int)*local_70 + -1);
            UNLOCK();
            if (local_88 != (float *)0x0 && *local_70 == 0.0) {
              free(local_88);
            }
          }
          pMVar23 = local_90;
          if (local_68 != (float *)0x0) {
            LOCK();
            *local_68 = (float)((int)*local_68 + -1);
            UNLOCK();
            if (local_80 != (float *)0x0 && *local_68 == 0.0) {
              free(local_80);
            }
          }
          if (local_60 != (float *)0x0) {
            LOCK();
            *local_60 = (float)((int)*local_60 + -1);
            UNLOCK();
            if (local_a0 != (float *)0x0 && *local_60 == 0.0) {
              free(local_a0);
            }
          }
          if (local_58 != (float *)0x0) {
            LOCK();
            *local_58 = (float)((int)*local_58 + -1);
            UNLOCK();
            if (local_98 != (float *)0x0 && *local_58 == 0.0) {
              free(local_98);
            }
          }
          uVar36 = local_78 + 1;
          pfVar15 = local_c0;
        } while (uVar36 != local_40);
      }
    }
    else {
      if (uVar19 != 2) {
        if (uVar19 != 1) {
          fprintf(_stderr,"unsupported resize type %d %d %d\n",(ulong)uVar19,local_e0,uVar36);
          return -0xe9;
        }
        if ((int)local_e8 < 1) {
          return 0;
        }
        pvVar7 = bottom_blob->data;
        sVar32 = bottom_blob->cstep;
        sVar8 = bottom_blob->elemsize;
        iVar43 = (int)local_f8 + -1;
        uVar38 = (ulong)local_e8 & 0xffffffff;
        sVar9 = top_blob->elemsize;
        local_e8 = (float *)0x0;
        do {
          if (0 < (int)local_e0) {
            uVar20 = 0;
            pvVar14 = pvVar27;
            do {
              if (0 < (int)uVar21) {
                iVar34 = (int)((float)(int)uVar20 / this->height_scale);
                if ((int)(w - 1) < iVar34) {
                  iVar34 = w - 1;
                }
                uVar18 = 0;
                do {
                  iVar24 = (int)((float)(int)uVar18 / this->width_scale);
                  iVar29 = iVar43;
                  if (iVar24 <= iVar43) {
                    iVar29 = iVar24;
                  }
                  *(undefined4 *)((long)pvVar14 + uVar18 * 4) =
                       *(undefined4 *)
                        ((long)pvVar7 +
                        (long)(iVar29 + iVar34 * (int)local_f8) * 4 +
                        sVar32 * sVar8 * (long)local_e8);
                  uVar18 = uVar18 + 1;
                } while (uVar36 != uVar18);
              }
              uVar20 = uVar20 + 1;
              pvVar14 = (void *)((long)pvVar14 + uVar36 * 4);
            } while (uVar20 != ((ulong)local_e0 & 0xffffffff));
          }
          local_e8 = (float *)((long)local_e8 + 1);
          pvVar27 = (void *)((long)pvVar27 + local_f0 * sVar9);
        } while (local_e8 != (float *)uVar38);
        return 0;
      }
      iVar34 = (int)local_e0 * 3 + uVar21 * 3;
      uVar36 = local_f0 >> 0x20;
      local_f0 = CONCAT44((int)uVar36,uVar21 * 2);
      uVar36 = 0xffffffffffffffff;
      if (-1 < iVar34) {
        uVar36 = (long)iVar34 * 4;
      }
      pfVar15 = (float *)operator_new__(uVar36);
      local_b8 = (ulong)(int)uVar21;
      pfVar25 = pfVar15 + local_b8;
      lVar41 = (long)iVar43;
      pfVar17 = pfVar25 + lVar41;
      lVar26 = (long)(int)local_f0;
      linear_coeffs((int)local_f8,uVar21,(int *)pfVar15,pfVar17);
      local_b0 = pfVar25;
      local_a0 = pfVar17 + lVar26;
      linear_coeffs(w,(int)local_e0,(int *)pfVar25,pfVar17 + lVar26);
      uVar36 = local_b8;
      if (0 < (int)local_e8) {
        local_98 = (float *)((ulong)local_e8 & 0xffffffff);
        pfVar17 = (float *)0x0;
        pMVar23 = local_90;
        do {
          local_e8 = (float *)CONCAT44(local_e8._4_4_,pMVar23->w);
          local_f0 = pMVar23->elemsize;
          local_e0 = (float *)(pMVar23->cstep * (long)pfVar17 * local_f0 + (long)pMVar23->data);
          uVar21 = local_50->w;
          lVar26 = (long)(int)uVar21;
          uVar19 = local_50->h;
          pvVar27 = local_50->data;
          sVar32 = local_50->elemsize;
          uVar38 = local_50->cstep;
          local_d8 = pfVar17;
          if (lVar26 == 0) {
            local_a8 = (float *)0x0;
            local_c8 = (float *)0x0;
            local_c0 = (float *)0x0;
            local_d0 = (float *)0x0;
          }
          else {
            sVar2 = lVar26 * 4 + 4;
            local_100 = (float *)0x0;
            local_f8 = sVar32;
            local_78 = uVar38;
            iVar43 = posix_memalign(&local_100,0x10,sVar2);
            local_c8 = local_100;
            local_a8 = (float *)0x0;
            if (iVar43 == 0) {
              local_a8 = local_100;
            }
            local_a8 = local_a8 + lVar26;
            *local_a8 = 1.4013e-45;
            local_100 = (float *)0x0;
            iVar43 = posix_memalign(&local_100,0x10,sVar2);
            local_d0 = local_100;
            local_c0 = (float *)0x0;
            if (iVar43 == 0) {
              local_c0 = local_100;
            }
            local_c0 = local_c0 + lVar26;
            *local_c0 = 1.4013e-45;
            uVar38 = local_78;
            sVar32 = local_f8;
          }
          if (0 < (int)uVar19) {
            local_f8 = sVar32 * lVar26;
            pvVar27 = (void *)((long)pvVar27 + uVar38 * sVar32 * (long)local_d8);
            uVar38 = 0;
            pfVar17 = local_a0;
            pfVar25 = local_c8;
            pfVar30 = local_d0;
            fVar33 = -NAN;
            do {
              fVar35 = local_b0[uVar38];
              pfVar16 = pfVar25;
              if (fVar35 == fVar33) {
LAB_0016a1cd:
                if (0 < (int)uVar21) {
                  fVar33 = *pfVar17;
                  fVar44 = pfVar17[1];
                  lVar26 = 0;
                  do {
                    *(float *)((long)pvVar27 + lVar26 * 4) =
                         pfVar30[lVar26] * fVar44 + pfVar16[lVar26] * fVar33;
                    lVar26 = lVar26 + 1;
                  } while (uVar21 != (uint)lVar26);
                }
              }
              else if (fVar35 == (float)((int)fVar33 + 1)) {
                pfVar16 = pfVar30;
                pfVar30 = pfVar25;
                if (0 < (int)uVar21) {
                  uVar20 = 0;
                  do {
                    uVar4 = *(undefined8 *)
                             ((long)local_e0 +
                             (long)(int)pfVar15[uVar20] * 4 +
                             (long)(((int)fVar35 + 1) * (int)local_e8) * local_f0);
                    pfVar25[uVar20] =
                         (float)((ulong)uVar4 >> 0x20) *
                         (float)((ulong)*(undefined8 *)(pfVar15 + uVar36 + lVar41 + uVar20 * 2) >>
                                0x20) +
                         (float)uVar4 *
                         (float)*(undefined8 *)(pfVar15 + uVar36 + lVar41 + uVar20 * 2);
                    uVar20 = uVar20 + 1;
                  } while (uVar21 != uVar20);
                  goto LAB_0016a1cd;
                }
              }
              else if (0 < (int)uVar21) {
                uVar20 = 0;
                do {
                  fVar33 = pfVar15[uVar20];
                  uVar4 = *(undefined8 *)
                           ((long)local_e0 +
                           (long)(int)fVar33 * 4 + (long)((int)fVar35 * (int)local_e8) * local_f0);
                  fVar44 = (float)*(undefined8 *)(pfVar15 + uVar36 + lVar41 + uVar20 * 2);
                  fVar46 = (float)((ulong)*(undefined8 *)(pfVar15 + uVar36 + lVar41 + uVar20 * 2) >>
                                  0x20);
                  pfVar25[uVar20] = (float)((ulong)uVar4 >> 0x20) * fVar46 + (float)uVar4 * fVar44;
                  uVar4 = *(undefined8 *)
                           ((long)local_e0 +
                           (long)(int)fVar33 * 4 +
                           (long)(((int)fVar35 + 1) * (int)local_e8) * local_f0);
                  pfVar30[uVar20] = (float)((ulong)uVar4 >> 0x20) * fVar46 + (float)uVar4 * fVar44;
                  uVar20 = uVar20 + 1;
                } while (uVar21 != uVar20);
                goto LAB_0016a1cd;
              }
              pfVar17 = pfVar17 + 2;
              uVar38 = uVar38 + 1;
              pvVar27 = (void *)((long)pvVar27 + local_f8);
              pfVar25 = pfVar16;
              fVar33 = fVar35;
              local_b8 = (ulong)uVar19;
            } while (uVar38 != uVar19);
          }
          if (local_c0 != (float *)0x0) {
            LOCK();
            *local_c0 = (float)((int)*local_c0 + -1);
            UNLOCK();
            if (local_d0 != (float *)0x0 && *local_c0 == 0.0) {
              free(local_d0);
            }
          }
          pMVar23 = local_90;
          if (local_a8 != (float *)0x0) {
            LOCK();
            *local_a8 = (float)((int)*local_a8 + -1);
            UNLOCK();
            if (local_c8 != (float *)0x0 && *local_a8 == 0.0) {
              free(local_c8);
            }
          }
          pfVar17 = (float *)((long)local_d8 + 1);
        } while (pfVar17 != local_98);
      }
    }
    operator_delete__(pfVar15);
  }
  return 0;
}

Assistant:

int Interp::forward(const Mat &bottom_blob, Mat &top_blob, const Option& opt) const
{
    int h = bottom_blob.h;
    int w = bottom_blob.w;
    int c = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int oh = output_height;
    int ow = output_width;
    if (bottom_blob.dims == 1)
    {
        h = 1;
        w = 1;
        c = bottom_blob.w;
    }
    if (oh == 0 || ow == 0)
    {
        oh = h * height_scale;
        ow = w * width_scale;
    }
    if (oh == h && ow == w)
    {
        top_blob = bottom_blob;
        return 0;
    }
    top_blob.create(ow, oh, c, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (bottom_blob.dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            Mat top_blob_c = top_blob.channel(q);
            const float *ptr = ((const float*)bottom_blob.data + q);
            top_blob_c.fill(*ptr);
        }
        return 0;
    }

    if (resize_type == 1)// nearest
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            const float *ptr = bottom_blob.channel(q);
            float *output_ptr = top_blob.channel(q);
            for (int y = 0; y < oh; ++y)
            {
                const int in_y = std::min((int) (y / height_scale), (h - 1));
                for (int x = 0; x < ow; ++x)
                {
                    const int in_x = std::min((int) (x / width_scale), (w - 1));
                    output_ptr[ow * y + x] = ptr[in_y * w + in_x];
                }
            }
        }
        return 0;

    }
    else if (resize_type == 2)// bilinear
    {
        int* buf = new int[ow + oh + ow*2 + oh*2];

        int* xofs = buf;//new int[ow];
        int* yofs = buf + ow;//new int[oh];

        float* alpha = (float*)(buf + ow + oh);//new float[ow * 2];
        float* beta = (float*)(buf + ow + oh + ow*2);//new float[oh * 2];

        linear_coeffs(w, ow, xofs, alpha);
        linear_coeffs(h, oh, yofs, beta);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            const Mat src = bottom_blob.channel(q);
            Mat dst = top_blob.channel(q);

            resize_bilinear_image(src, dst, alpha, xofs, beta, yofs);
        }

        delete[] buf;

        return 0;
    }
    else if (resize_type == 3)// bicubic
    {
        int* buf = new int[ow + oh + ow*4 + oh*4];

        int* xofs = buf;//new int[ow];
        int* yofs = buf + ow;//new int[oh];

        float* alpha = (float*)(buf + ow + oh);//new float[ow * 4];
        float* beta = (float*)(buf + ow + oh + ow*4);//new float[oh * 4];

        cubic_coeffs(w, ow, xofs, alpha);
        cubic_coeffs(h, oh, yofs, beta);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            const Mat src = bottom_blob.channel(q);
            Mat dst = top_blob.channel(q);

            resize_bicubic_image(src, dst, alpha, xofs, beta, yofs);
        }

        delete[] buf;

        return 0;
    }
    else
    {
        fprintf(stderr, "unsupported resize type %d %d %d\n", resize_type, oh, ow);
        return -233;
    }
}